

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_setopt(Curl_multi *multi,CURLMoption option,...)

{
  curl_push_callback local_e8;
  long local_e0;
  uint local_48;
  long streams;
  unsigned_long uarg;
  va_list param;
  CURLMcode res;
  CURLMoption option_local;
  Curl_multi *multi_local;
  
  param[0].reg_save_area._0_4_ = CURLM_OK;
  if ((multi == (Curl_multi *)0x0) || (multi->magic != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if (((byte)multi->field_0x279 >> 2 & 1) == 0) {
    if (option == CURLMOPT_PIPELINING) {
      param[0].reg_save_area._0_4_ = CURLM_OK;
      multi->field_0x279 = multi->field_0x279 & 0xfe | ((ulong)local_e8 & 2) != 0;
    }
    else {
      local_48 = (uint)local_e8;
      if (option == CURLMOPT_MAXCONNECTS) {
        param[0].reg_save_area._0_4_ = CURLM_OK;
        if (local_e8 < (curl_push_callback)0x100000000) {
          multi->maxconnects = local_48;
        }
      }
      else if (option == CURLMOPT_MAX_HOST_CONNECTIONS) {
        param[0].reg_save_area._0_4_ = CURLM_OK;
        multi->max_host_connections = (long)local_e8;
      }
      else if (option != CURLMOPT_MAX_PIPELINE_LENGTH) {
        if (option == CURLMOPT_MAX_TOTAL_CONNECTIONS) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          multi->max_total_connections = (long)local_e8;
          multi->max_shutdown_connections = local_e0;
        }
        else if (option == CURLMOPT_MAX_CONCURRENT_STREAMS) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          if (((long)local_e8 < 1) || (0x7fffffff < (long)local_e8)) {
            local_48 = 100;
          }
          multi->max_concurrent_streams = local_48;
        }
        else if (option == CURLMOPT_SOCKETDATA) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          multi->socket_userp = local_e8;
        }
        else if (option == CURLMOPT_TIMERDATA) {
          param[0].reg_save_area._0_4_ = CURLM_OK;
          multi->timer_userp = local_e8;
        }
        else if ((option != CURLMOPT_PIPELINING_SITE_BL) &&
                (option != CURLMOPT_PIPELINING_SERVER_BL)) {
          if (option == CURLMOPT_PUSHDATA) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            multi->push_userp = local_e8;
          }
          else if (option == CURLMOPT_SOCKETFUNCTION) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            multi->socket_cb = (curl_socket_callback)local_e8;
          }
          else if (option == CURLMOPT_TIMERFUNCTION) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            multi->timer_cb = (curl_multi_timer_callback)local_e8;
          }
          else if (option == CURLMOPT_PUSHFUNCTION) {
            param[0].reg_save_area._0_4_ = CURLM_OK;
            multi->push_cb = local_e8;
          }
          else if ((option != CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE) &&
                  (option != CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE)) {
            param[0].reg_save_area._0_4_ = CURLM_UNKNOWN_OPTION;
          }
        }
      }
    }
    multi_local._4_4_ = (CURLMcode)param[0].reg_save_area;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_setopt(struct Curl_multi *multi,
                            CURLMoption option, ...)
{
  CURLMcode res = CURLM_OK;
  va_list param;
  unsigned long uarg;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PUSHFUNCTION:
    multi->push_cb = va_arg(param, curl_push_callback);
    break;
  case CURLMOPT_PUSHDATA:
    multi->push_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->multiplexing = va_arg(param, long) & CURLPIPE_MULTIPLEX ? 1 : 0;
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    uarg = va_arg(param, unsigned long);
    if(uarg <= UINT_MAX)
      multi->maxconnects = (unsigned int)uarg;
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    /* for now, let this also decide the max number of connections
     * in shutdown handling */
    multi->max_shutdown_connections = va_arg(param, long);
    break;
    /* options formerly used for pipelining */
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    break;
  case CURLMOPT_MAX_CONCURRENT_STREAMS:
    {
      long streams = va_arg(param, long);
      if((streams < 1) || (streams > INT_MAX))
        streams = 100;
      multi->max_concurrent_streams = (unsigned int)streams;
    }
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}